

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp_math.c
# Opt level: O3

int s_mp_mul_digs(mp_int *a,mp_int *b,mp_int *c,int digs)

{
  mp_digit *pmVar1;
  ulong uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined8 uVar6;
  undefined8 uVar7;
  int iVar8;
  int iVar9;
  mp_digit *pmVar10;
  int iVar11;
  int iVar12;
  long lVar13;
  ulong uVar14;
  long lVar15;
  mp_digit mVar16;
  long lVar17;
  mp_digit *pmVar18;
  int iVar19;
  ulong uVar20;
  mp_int t;
  mp_int local_98;
  mp_int *local_78;
  mp_digit *local_70;
  mp_digit *local_68;
  ulong local_60;
  long local_58;
  long local_50;
  mp_int local_48;
  
  uVar20 = (ulong)(uint)digs;
  if (digs < 0x200) {
    iVar8 = b->used;
    if (a->used < b->used) {
      iVar8 = a->used;
    }
    if (iVar8 < 0x100) {
      iVar8 = fast_s_mp_mul_digs(a,b,c,digs);
      return iVar8;
    }
  }
  iVar8 = mp_init_size(&local_98,digs);
  if (iVar8 == 0) {
    local_98.used = digs;
    local_50 = (long)a->used;
    if (0 < local_50) {
      iVar8 = b->used;
      local_58 = (long)iVar8;
      local_68 = a->dp;
      pmVar1 = b->dp;
      lVar17 = 0;
      local_70 = local_98.dp;
      pmVar18 = local_98.dp;
      iVar12 = digs;
      do {
        iVar11 = iVar12;
        if (local_58 < iVar12) {
          iVar11 = iVar8;
        }
        iVar19 = iVar12;
        if (iVar8 < iVar12) {
          iVar19 = iVar8;
        }
        iVar9 = digs - (int)lVar17;
        if (iVar8 < iVar9) {
          iVar9 = iVar8;
        }
        if (iVar9 < 1) {
          pmVar10 = local_98.dp + lVar17;
          iVar19 = 0;
          mVar16 = 0;
        }
        else {
          uVar2 = local_68[lVar17];
          lVar15 = 0;
          lVar13 = 0;
          mVar16 = 0;
          do {
            auVar3._8_8_ = 0;
            auVar3._0_8_ = uVar2;
            auVar4._8_8_ = 0;
            auVar4._0_8_ = pmVar1[lVar13];
            auVar5[8] = CARRY8(mVar16,pmVar18[lVar13]);
            auVar5._0_8_ = mVar16 + pmVar18[lVar13];
            auVar5._9_7_ = 0;
            auVar5 = auVar3 * auVar4 + auVar5;
            uVar14 = auVar5._0_8_;
            mVar16 = auVar5._8_8_ << 4 | uVar14 >> 0x3c;
            pmVar18[lVar13] = uVar14 & 0xfffffffffffffff;
            lVar13 = lVar13 + 1;
            lVar15 = lVar15 + -8;
          } while (iVar11 != (int)lVar13);
          pmVar10 = (mp_digit *)((long)pmVar18 - lVar15);
        }
        if ((int)lVar17 + iVar19 < digs) {
          *pmVar10 = mVar16;
        }
        lVar17 = lVar17 + 1;
        iVar12 = iVar12 + -1;
        pmVar18 = pmVar18 + 1;
        local_60 = uVar20;
      } while (lVar17 != local_50);
    }
    if (digs < 1) {
      if (digs == 0) {
LAB_00104e6f:
        local_98._8_8_ = local_98._8_8_ & 0xffffffff00000000;
      }
    }
    else {
      mVar16 = local_98.dp[uVar20 - 1];
      while (mVar16 == 0) {
        if ((long)uVar20 < 2) {
          local_98.used = (int)uVar20 + -1;
          goto LAB_00104e6f;
        }
        mVar16 = local_98.dp[uVar20 - 2];
        uVar20 = uVar20 - 1;
      }
      local_98.used = (int)uVar20;
    }
    local_48.dp = local_98.dp;
    local_48.used = local_98.used;
    local_48.alloc = local_98.alloc;
    local_48.sign = local_98.sign;
    local_48._12_4_ = local_98._12_4_;
    pmVar1 = c->dp;
    uVar6._0_4_ = c->used;
    uVar6._4_4_ = c->alloc;
    uVar7._0_4_ = c->sign;
    uVar7._4_4_ = *(undefined4 *)&c->field_0xc;
    c->used = local_98.used;
    c->alloc = local_98.alloc;
    c->sign = local_98.sign;
    *(undefined4 *)&c->field_0xc = local_98._12_4_;
    c->dp = local_98.dp;
    iVar8 = 0;
    if (pmVar1 != (mp_digit *)0x0) {
      local_98._0_8_ = uVar6;
      local_98._8_8_ = uVar7;
      local_98.dp = pmVar1;
      local_78 = c;
      free(pmVar1);
      iVar8 = 0;
    }
  }
  return iVar8;
}

Assistant:

int s_mp_mul_digs (mp_int * a, mp_int * b, mp_int * c, int digs)
{
  mp_int  t;
  int     res, pa, pb, ix, iy;
  mp_digit u;
  mp_word r;
  mp_digit tmpx, *tmpt, *tmpy;

  /* can we use the fast multiplier? */
  if (((digs) < MP_WARRAY) &&
      MIN (a->used, b->used) < 
          (1 << ((CHAR_BIT * sizeof (mp_word)) - (2 * DIGIT_BIT)))) {
    return fast_s_mp_mul_digs (a, b, c, digs);
  }

  if ((res = mp_init_size (&t, digs)) != MP_OKAY) {
    return res;
  }
  t.used = digs;

  /* compute the digits of the product directly */
  pa = a->used;
  for (ix = 0; ix < pa; ix++) {
    /* set the carry to zero */
    u = 0;

    /* limit ourselves to making digs digits of output */
    pb = MIN (b->used, digs - ix);

    /* setup some aliases */
    /* copy of the digit from a used within the nested loop */
    tmpx = a->dp[ix];
    
    /* an alias for the destination shifted ix places */
    tmpt = t.dp + ix;
    
    /* an alias for the digits of b */
    tmpy = b->dp;

    /* compute the columns of the output and propagate the carry */
    for (iy = 0; iy < pb; iy++) {
      /* compute the column as a mp_word */
      r       = ((mp_word)*tmpt) +
                ((mp_word)tmpx) * ((mp_word)*tmpy++) +
                ((mp_word) u);

      /* the new column is the lower part of the result */
      *tmpt++ = (mp_digit) (r & ((mp_word) MP_MASK));

      /* get the carry word from the result */
      u       = (mp_digit) (r >> ((mp_word) DIGIT_BIT));
    }
    /* set carry if it is placed below digs */
    if (ix + iy < digs) {
      *tmpt = u;
    }
  }

  mp_clamp (&t);
  mp_exch (&t, c);

  mp_clear (&t);
  return MP_OKAY;
}